

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

int AF_AActor_CheckSight
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  AActor *t1;
  AActor *t2;
  bool bVar5;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00450c9e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00450c85:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00450c9e:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                  ,0x391,
                  "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  t1 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (t1 == (AActor *)0x0) goto LAB_00450b63;
    pPVar2 = (t1->super_DThinker).super_DObject.Class;
    if (pPVar2 == (PClass *)0x0) {
      iVar1 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
      pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
      (t1->super_DThinker).super_DObject.Class = pPVar2;
    }
    bVar5 = pPVar2 != (PClass *)0x0;
    if (pPVar2 != pPVar3 && bVar5) {
      do {
        pPVar2 = pPVar2->ParentClass;
        bVar5 = pPVar2 != (PClass *)0x0;
        if (pPVar2 == pPVar3) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00450c9e;
    }
  }
  else {
    if (t1 != (AActor *)0x0) goto LAB_00450c85;
LAB_00450b63:
    t1 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_00450cbd;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_00450c8e:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_00450cbd;
  }
  t2 = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (t2 == (AActor *)0x0) goto LAB_00450b96;
LAB_00450bab:
    pPVar2 = AActor::RegistrationInfo.MyClass;
    pPVar3 = (t2->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (t2->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar2 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar2) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "target == NULL || target->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_00450cbd:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                    ,0x392,
                    "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
  }
  else {
    if (t2 != (AActor *)0x0) goto LAB_00450c8e;
LAB_00450b96:
    NullParam("\"target\"");
    t2 = (AActor *)param[1].field_0.field_1.a;
    if (t2 != (AActor *)0x0) goto LAB_00450bab;
    t2 = (AActor *)0x0;
  }
  if (numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type == '\0') goto LAB_00450c43;
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
LAB_00450c43:
      bVar5 = P_CheckSight(t1,t2,param[2].field_0.i);
      if (numret < 1) {
        iVar1 = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                        ,0x394,
                        "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        if (ret->RegType != '\0') {
          __assert_fail("RegType == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                        ,0x13f,"void VMReturn::SetInt(int)");
        }
        *(uint *)ret->Location = (uint)bVar5;
        iVar1 = 1;
      }
      return iVar1;
    }
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_sight.cpp"
                ,0x393,
                "int AF_AActor_CheckSight(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckSight)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(target, AActor);
	PARAM_INT_DEF(flags);
	ACTION_RETURN_BOOL(P_CheckSight(self, target, flags));
}